

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# service.cpp
# Opt level: O1

thread_pool * __thiscall cppcms::service::thread_pool(service *this)

{
  service *psVar1;
  thread_pool *this_00;
  
  psVar1 = (this->impl_).ptr_;
  if ((psVar1->thread_pool_)._M_t.
      super___uniq_ptr_impl<cppcms::thread_pool,_std::default_delete<cppcms::thread_pool>_>._M_t.
      super__Tuple_impl<0UL,_cppcms::thread_pool_*,_std::default_delete<cppcms::thread_pool>_>.
      super__Head_base<0UL,_cppcms::thread_pool_*,_false>._M_head_impl == (thread_pool *)0x0) {
    this_00 = (thread_pool *)operator_new(8);
    cppcms::thread_pool::thread_pool
              (this_00,*(int *)((long)&((psVar1->cached_settings_)._M_t.
                                        super___uniq_ptr_impl<cppcms::impl::cached_settings,_std::default_delete<cppcms::impl::cached_settings>_>
                                        ._M_t.
                                        super__Tuple_impl<0UL,_cppcms::impl::cached_settings_*,_std::default_delete<cppcms::impl::cached_settings>_>
                                        .
                                        super__Head_base<0UL,_cppcms::impl::cached_settings_*,_false>
                                       ._M_head_impl)->service + 0x34));
    std::__uniq_ptr_impl<cppcms::thread_pool,_std::default_delete<cppcms::thread_pool>_>::reset
              ((__uniq_ptr_impl<cppcms::thread_pool,_std::default_delete<cppcms::thread_pool>_> *)
               &psVar1->thread_pool_,this_00);
  }
  return (((this->impl_).ptr_)->thread_pool_)._M_t.
         super___uniq_ptr_impl<cppcms::thread_pool,_std::default_delete<cppcms::thread_pool>_>._M_t.
         super__Tuple_impl<0UL,_cppcms::thread_pool_*,_std::default_delete<cppcms::thread_pool>_>.
         super__Head_base<0UL,_cppcms::thread_pool_*,_false>._M_head_impl;
}

Assistant:

cppcms::thread_pool &service::thread_pool()
{
	if(!impl_->thread_pool_.get()) {
		impl_->thread_pool_.reset(new cppcms::thread_pool(threads_no()));
	}
	return *impl_->thread_pool_;
}